

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandDch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  Dch_Pars_t Pars;
  Dch_Pars_t local_80;
  Abc_Frame_t *local_40;
  Abc_Ntk_t *local_38;
  
  local_40 = pAbc;
  local_38 = Abc_FrameReadNtk(pAbc);
  Dch_ManSetDefaultParams(&local_80);
  Extra_UtilGetoptReset();
LAB_0025e175:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"WCSsptgcfrvh");
    iVar5 = globalUtilOptind;
    if (iVar1 < 0x57) {
      if (iVar1 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0025e2b7:
          Abc_Print(-1,pcVar3);
          goto switchD_0025e196_caseD_64;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_80.nBTLimit = uVar2;
      }
      else {
        if (iVar1 != 0x53) {
          if (iVar1 == -1) {
            if (local_38 == (Abc_Ntk_t *)0x0) {
              pcVar3 = "Empty network.\n";
            }
            else {
              if (local_38->ntkType == ABC_NTK_STRASH) {
                pNtk = Abc_NtkDch(local_38,&local_80);
                if (pNtk != (Abc_Ntk_t *)0x0) {
                  Abc_FrameReplaceCurrentNetwork(local_40,pNtk);
                  return 0;
                }
                Abc_Print(-1,"Command has failed.\n");
                return 0;
              }
              pcVar3 = "This command works only for strashed networks.\n";
            }
            iVar5 = -1;
            goto LAB_0025e440;
          }
          goto switchD_0025e196_caseD_64;
        }
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-S\" should be followed by an integer.\n";
          goto LAB_0025e2b7;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_80.nSatVarMax = uVar2;
      }
    }
    else {
      switch(iVar1) {
      case 99:
        local_80.fUseCSat = local_80.fUseCSat ^ 1;
        goto LAB_0025e175;
      case 100:
      case 0x65:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x71:
      case 0x75:
        goto switchD_0025e196_caseD_64;
      case 0x66:
        local_80.fLightSynth = local_80.fLightSynth ^ 1;
        goto LAB_0025e175;
      case 0x67:
        local_80.fUseGia = local_80.fUseGia ^ 1;
        goto LAB_0025e175;
      case 0x70:
        local_80.fPower = local_80.fPower ^ 1;
        goto LAB_0025e175;
      case 0x72:
        local_80.fSkipRedSupp = local_80.fSkipRedSupp ^ 1;
        goto LAB_0025e175;
      case 0x73:
        local_80.fSynthesis = local_80.fSynthesis ^ 1;
        goto LAB_0025e175;
      case 0x74:
        local_80.fSimulateTfo = local_80.fSimulateTfo ^ 1;
        goto LAB_0025e175;
      case 0x76:
        local_80.fVerbose = local_80.fVerbose ^ 1;
        goto LAB_0025e175;
      default:
        if (iVar1 != 0x57) goto switchD_0025e196_caseD_64;
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-W\" should be followed by an integer.\n";
          goto LAB_0025e2b7;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_80.nWords = uVar2;
      }
    }
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
switchD_0025e196_caseD_64:
      Abc_Print(-2,"usage: dch [-WCS num] [-sptgcfrvh]\n");
      Abc_Print(-2,"\t         computes structural choices using a new approach\n");
      Abc_Print(-2,"\t-W num : the max number of simulation words [default = %d]\n",
                (ulong)(uint)local_80.nWords);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)local_80.nBTLimit);
      Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",
                (ulong)(uint)local_80.nSatVarMax);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (local_80.fSynthesis == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle synthesizing three snapshots [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_80.fPower == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle power-aware rewriting [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_80.fSimulateTfo == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle simulation of the TFO classes [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_80.fUseGia == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-g     : toggle using GIA to prove equivalences [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_80.fUseCSat == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle using circuit-based SAT vs. MiniSat [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_80.fLightSynth == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle using faster logic synthesis [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_80.fSkipRedSupp == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle skipping choices with redundant support [default = %s]\n",
                pcVar3);
      if (local_80.fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar5 = -2;
LAB_0025e440:
      Abc_Print(iVar5,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Dch_Pars_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    extern Abc_Ntk_t * Abc_NtkDch( Abc_Ntk_t * pNtk, Dch_Pars_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Dch_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCSsptgcfrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 's':
            pPars->fSynthesis ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 't':
            pPars->fSimulateTfo ^= 1;
            break;
        case 'g':
            pPars->fUseGia ^= 1;
            break;
        case 'c':
            pPars->fUseCSat ^= 1;
            break;
        case 'f':
            pPars->fLightSynth ^= 1;
            break;
        case 'r':
            pPars->fSkipRedSupp ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDch( pNtk, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dch [-WCS num] [-sptgcfrvh]\n" );
    Abc_Print( -2, "\t         computes structural choices using a new approach\n" );
    Abc_Print( -2, "\t-W num : the max number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-s     : toggle synthesizing three snapshots [default = %s]\n", pPars->fSynthesis? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle power-aware rewriting [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle simulation of the TFO classes [default = %s]\n", pPars->fSimulateTfo? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle using GIA to prove equivalences [default = %s]\n", pPars->fUseGia? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT vs. MiniSat [default = %s]\n", pPars->fUseCSat? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle using faster logic synthesis [default = %s]\n", pPars->fLightSynth? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle skipping choices with redundant support [default = %s]\n", pPars->fSkipRedSupp? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}